

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::MergeFrom
          (RandomUniformLikeLayerParams *this,RandomUniformLikeLayerParams *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb873);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->seed_ != 0) {
    this->seed_ = from->seed_;
  }
  if (from->minval_ != 0.0) {
    this->minval_ = from->minval_;
  }
  if (from->maxval_ != 0.0) {
    this->maxval_ = from->maxval_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void RandomUniformLikeLayerParams::MergeFrom(const RandomUniformLikeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomUniformLikeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_seed() != 0) {
    _internal_set_seed(from._internal_seed());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_minval = from._internal_minval();
  uint32_t raw_minval;
  memcpy(&raw_minval, &tmp_minval, sizeof(tmp_minval));
  if (raw_minval != 0) {
    _internal_set_minval(from._internal_minval());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_maxval = from._internal_maxval();
  uint32_t raw_maxval;
  memcpy(&raw_maxval, &tmp_maxval, sizeof(tmp_maxval));
  if (raw_maxval != 0) {
    _internal_set_maxval(from._internal_maxval());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}